

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple16.h
# Opt level: O1

bool FastPForLib::Simple16<false>::trymefull<1u,3u,4u,4u,3u,3u>(uint32_t *n)

{
  bool bVar1;
  bool bVar2;
  long lVar3;
  ulong uVar4;
  
  bVar2 = true;
  do {
    bVar1 = bVar2;
    if (!bVar1) goto LAB_0014fa21;
    bVar2 = false;
  } while (*n < 8);
  if (!bVar1) {
LAB_0014fa21:
    lVar3 = 0;
    do {
      if (0xf < n[lVar3 + 1]) {
        return false;
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 != 4);
    uVar4 = 4;
    while (n[uVar4 + 1] < 8) {
      uVar4 = uVar4 + 1;
      if (uVar4 == 7) {
        return 6 < uVar4;
      }
    }
  }
  return false;
}

Assistant:

__attribute__((pure)) static bool trymefull(const uint32_t *n) {
    const uint32_t min1 = num1;
    for (uint32_t i = 0; i < min1; i++) {
      if (n[i] >= (1U << log1))
        return false;
    }
    const uint32_t min2 = num2;

    for (uint32_t i = min1; i < min1 + min2; i++) {
      if (n[i] >= (1U << log2))
        return false;
    }
    const uint32_t min3 = num3;
    for (uint32_t i = min1 + min2; i < min1 + min2 + min3; i++) {
      if (n[i] >= (1U << log3))
        return false;
    }
    return true;
  }